

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

void __thiscall
Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
resizeLike<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>const,Eigen::Transpose<Eigen::Array<double,_1,1,0,_1,1>const>const>>
          (PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *this,
          EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Transpose<const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>
          *_other)

{
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Transpose<const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  *this_00;
  Index IVar1;
  Index IVar2;
  Index IVar3;
  bool bVar4;
  Index othersize;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Transpose<const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  *other;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Transpose<const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>
  *_other_local;
  PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *this_local;
  bool error;
  long max_index;
  
  this_00 = EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Transpose<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>_>
            ::derived(_other);
  IVar1 = CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Transpose<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
          ::rows(this_00);
  IVar2 = CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Transpose<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
          ::cols(this_00);
  if ((IVar1 == 0) || (IVar2 == 0)) {
    bVar4 = false;
  }
  else {
    bVar4 = 0x7fffffffffffffff / IVar2 < IVar1;
  }
  if (bVar4) {
    internal::throw_std_bad_alloc();
  }
  IVar1 = CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Transpose<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
          ::rows(this_00);
  IVar2 = CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Transpose<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
          ::cols(this_00);
  IVar3 = CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Transpose<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
          ::rows(this_00);
  bVar4 = true;
  if (IVar3 != 1) {
    IVar3 = CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Transpose<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
            ::cols(this_00);
    bVar4 = IVar3 == 1;
  }
  if (!bVar4) {
    __assert_fail("other.rows() == 1 || other.cols() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/usnistgov[P]isochoric/externals/CoolProp/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x176,
                  "void Eigen::PlainObjectBase<Eigen::Array<double, -1, 1>>::resizeLike(const EigenBase<OtherDerived> &) [Derived = Eigen::Array<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>>, const Eigen::Transpose<const Eigen::Array<double, -1, 1>>>]"
                 );
  }
  PlainObjectBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)this,IVar1 * IVar2,1);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC 
    EIGEN_STRONG_INLINE void resizeLike(const EigenBase<OtherDerived>& _other)
    {
      const OtherDerived& other = _other.derived();
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(other.rows(), other.cols());
      const Index othersize = other.rows()*other.cols();
      if(RowsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(1, othersize);
      }
      else if(ColsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(othersize, 1);
      }
      else resize(other.rows(), other.cols());
    }